

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_algorithm_suite.cpp
# Opt level: O0

void copy_suite::expand_copy_n(void)

{
  pointer *ppiVar1;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  size_type sVar2;
  iterator iVar3;
  iterator iVar4;
  iterator iVar5;
  iterator iVar6;
  basic_iterator<int> bVar7;
  allocator<int> local_161;
  int local_160 [4];
  iterator local_150;
  size_type local_148;
  undefined1 local_140 [8];
  vector<int,_std::allocator<int>_> expect_1;
  allocator<int> local_c9;
  int local_c8 [4];
  iterator local_b8;
  size_type local_b0;
  undefined1 local_a8 [8];
  vector<int,_std::allocator<int>_> expect;
  allocator<int> local_79;
  int local_78 [6];
  iterator local_60;
  size_type local_58;
  undefined1 local_50 [8];
  vector<int,_std::allocator<int>_> input;
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  
  span.member.next = 0;
  vista::circular_view<int,_18446744073709551615UL>::circular_view<4UL,_0>
            ((circular_view<int,_18446744073709551615UL> *)
             &input.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,(value_type (*) [4])&span.member.next);
  local_78[0] = 0xb;
  local_78[1] = 0x16;
  local_78[2] = 0x21;
  local_78[3] = 0x2c;
  local_78[4] = 0x37;
  local_60 = local_78;
  local_58 = 5;
  std::allocator<int>::allocator(&local_79);
  __l_01._M_len = local_58;
  __l_01._M_array = local_60;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_50,__l_01,&local_79);
  std::allocator<int>::~allocator(&local_79);
  ppiVar1 = &input.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  sVar2 = vista::circular_view<int,_18446744073709551615UL>::capacity
                    ((circular_view<int,_18446744073709551615UL> *)ppiVar1);
  vista::circular_view<int,_18446744073709551615UL>::expand_back
            ((circular_view<int,_18446744073709551615UL> *)ppiVar1,sVar2);
  local_c8[0] = 0;
  local_c8[1] = 0;
  local_c8[2] = 0;
  local_c8[3] = 0;
  local_b8 = local_c8;
  local_b0 = 4;
  std::allocator<int>::allocator(&local_c9);
  __l_00._M_len = local_b0;
  __l_00._M_array = local_b8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_a8,__l_00,&local_c9);
  std::allocator<int>::~allocator(&local_c9);
  ppiVar1 = &input.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  iVar5 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)ppiVar1);
  iVar6 = vista::circular_view<int,_18446744073709551615UL>::end
                    ((circular_view<int,_18446744073709551615UL> *)ppiVar1);
  iVar3 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_a8);
  iVar4 = std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)local_a8)
  ;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x4a,"void copy_suite::expand_copy_n()",iVar5,iVar6,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar3._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar4._M_current);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_a8);
  iVar3 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_50);
  ppiVar1 = &input.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  sVar2 = vista::circular_view<int,_18446744073709551615UL>::size
                    ((circular_view<int,_18446744073709551615UL> *)ppiVar1);
  iVar5 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)ppiVar1);
  bVar7 = std::
          copy_n<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,unsigned_long,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                    ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                     iVar3._M_current,sVar2,iVar5);
  expect_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)bVar7.parent;
  local_160[0] = 0xb;
  local_160[1] = 0x16;
  local_160[2] = 0x21;
  local_160[3] = 0x2c;
  local_150 = local_160;
  local_148 = 4;
  std::allocator<int>::allocator(&local_161);
  __l._M_len = local_148;
  __l._M_array = local_150;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_140,__l,&local_161);
  std::allocator<int>::~allocator(&local_161);
  ppiVar1 = &input.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  iVar5 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)ppiVar1);
  iVar6 = vista::circular_view<int,_18446744073709551615UL>::end
                    ((circular_view<int,_18446744073709551615UL> *)ppiVar1);
  iVar3 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_140);
  iVar4 = std::vector<int,_std::allocator<int>_>::end
                    ((vector<int,_std::allocator<int>_> *)local_140);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x50,"void copy_suite::expand_copy_n()",iVar5,iVar6,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar3._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar4._M_current);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_140);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_50);
  return;
}

Assistant:

void expand_copy_n()
{
    int array[4] = {};
    circular_view<int> span(array);
    std::vector<int> input = { 11, 22, 33, 44, 55 };
    span.expand_back(span.capacity());
    {
        std::vector<int> expect = { 0, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    std::copy_n(input.begin(), span.size(), span.begin());
    {
        std::vector<int> expect = { 11, 22, 33, 44 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}